

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

size_t __thiscall roaring::Roaring64Map::getSizeInBytes(Roaring64Map *this,bool portable)

{
  size_t sVar1;
  _Rb_tree_node_base *p_Var2;
  size_t sVar3;
  
  sVar3 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count * 4 + 8;
  for (p_Var2 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    sVar1 = Roaring::getSizeInBytes((Roaring *)&p_Var2[1]._M_parent,portable);
    sVar3 = sVar3 + sVar1;
  }
  return sVar3;
}

Assistant:

size_t getSizeInBytes(bool portable = true) const {
        // start with, respectively, map size and size of keys for each map
        // entry
        return std::accumulate(
            roarings.cbegin(), roarings.cend(),
            sizeof(uint64_t) + roarings.size() * sizeof(uint32_t),
            [=](size_t previous,
                const std::pair<const uint32_t, Roaring> &map_entry) {
                // add in bytes used by each Roaring
                return previous + map_entry.second.getSizeInBytes(portable);
            });
    }